

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraction.cpp
# Opt level: O0

Fraction * __thiscall Fraction::operator/=(Fraction *this,Fraction *b)

{
  Fraction *b_local;
  Fraction *this_local;
  
  if (b->numerator_ != 0) {
    this->numerator_ = b->denominator_ * this->numerator_;
    this->denominator_ = b->numerator_ * this->denominator_;
    Normalization(this);
    return this;
  }
  __assert_fail("b.numerator_ != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                ,0xb6,"const Fraction &Fraction::operator/=(const Fraction &)");
}

Assistant:

const Fraction& Fraction::operator/=(const Fraction& b) {
  assert(b.numerator_ != 0);
  numerator_ *= b.denominator_;
  denominator_ *= b.numerator_;
  Normalization();
  return *this;
}